

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

us_poll_t * us_poll_resize(us_poll_t *p,us_loop_t *loop,uint ext_size)

{
  int old_events;
  int iVar1;
  us_poll_t *p_00;
  uint in_EDX;
  us_loop_t *in_RSI;
  us_poll_t *in_RDI;
  us_poll_t *new_p;
  int events;
  
  old_events = us_poll_events(in_RDI);
  p_00 = (us_poll_t *)realloc(in_RDI,(ulong)in_EDX + 0x10);
  if ((in_RDI != p_00) && (old_events != 0)) {
    iVar1 = us_internal_poll_type(p_00);
    p_00->state = (anon_struct_4_2_c726803f_for_state)
                  ((uint)p_00->state & 0xfffffff | iVar1 << 0x1c);
    us_poll_change((us_poll_t *)in_RSI,(us_loop_t *)CONCAT44(in_EDX,old_events),
                   (int)((ulong)p_00 >> 0x20));
    us_internal_loop_update_pending_ready_polls(in_RSI,in_RDI,p_00,old_events,old_events);
  }
  return p_00;
}

Assistant:

struct us_poll_t *us_poll_resize(struct us_poll_t *p, struct us_loop_t *loop, unsigned int ext_size) {
    int events = us_poll_events(p);

    struct us_poll_t *new_p = realloc(p, sizeof(struct us_poll_t) + ext_size);
    if (p != new_p && events) {
#ifdef LIBUS_USE_EPOLL
        /* Hack: forcefully update poll by stripping away already set events */
        new_p->state.poll_type = us_internal_poll_type(new_p);
        us_poll_change(new_p, loop, events);
#else
        /* Forcefully update poll by resetting them with new_p as user data */
        kqueue_change(loop->fd, new_p->state.fd, 0, events, new_p);
#endif

        /* This is needed for epoll also (us_change_poll doesn't update the old poll) */
        us_internal_loop_update_pending_ready_polls(loop, p, new_p, events, events);
    }

    return new_p;
}